

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_relation.cpp
# Opt level: O0

void __thiscall
duckdb::ValueRelation::ValueRelation
          (ValueRelation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          vector<duckdb::vector<duckdb::Value,_true>,_true> *values,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names_p,string *alias_p)

{
  undefined8 uVar1;
  size_type sVar2;
  element_type *peVar3;
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  *in_RDX;
  Value *in_RDI;
  string *in_R8;
  idx_t col_idx;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expressions;
  value_type *list;
  idx_t row_idx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_000000d0;
  vector<duckdb::ColumnDefinition,_true> *in_stack_fffffffffffffee8;
  Relation *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  RelationType type;
  ulong uVar4;
  shared_ptr<duckdb::RelationContextWrapper,_true> *in_stack_ffffffffffffff18;
  Relation *in_stack_ffffffffffffff20;
  undefined1 local_98 [48];
  ulong local_68;
  allocator local_49;
  string local_48 [48];
  vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
  *local_18;
  
  type = (RelationType)((ulong)in_stack_ffffffffffffff10 >> 0x38);
  local_18 = in_RDX;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,anon_var_dwarf_3eb64fd + 9,&local_49);
  Relation::Relation(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,type,
                     in_stack_ffffffffffffff08);
  ::std::__cxx11::string::~string(local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *(undefined ***)&in_RDI->type_ = &PTR__ValueRelation_035333b8;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  ::vector((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
            *)0x1960749);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffef0,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_stack_fffffffffffffee8);
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x196077a);
  ::std::__cxx11::string::string((string *)&in_RDI[2].value_info_,in_R8);
  local_68 = 0;
  while( true ) {
    uVar4 = local_68;
    sVar2 = ::std::
            vector<duckdb::vector<duckdb::Value,_true>,_std::allocator<duckdb::vector<duckdb::Value,_true>_>_>
            ::size(local_18);
    if (sVar2 <= uVar4) break;
    local_98._40_8_ =
         vector<duckdb::vector<duckdb::Value,_true>,_true>::operator[]
                   ((vector<duckdb::vector<duckdb::Value,_true>,_true> *)in_stack_fffffffffffffef0,
                    (size_type)in_stack_fffffffffffffee8);
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)0x1960802);
    local_98._8_8_ = (element_type *)0x0;
    while( true ) {
      uVar1 = local_98._8_8_;
      peVar3 = (element_type *)
               ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size
                         ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_98._40_8_);
      if (peVar3 <= (ulong)uVar1) break;
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffffef0,
                 (size_type)in_stack_fffffffffffffee8);
      make_uniq<duckdb::ConstantExpression,duckdb::Value_const&>(in_RDI);
      in_stack_fffffffffffffef0 = (Relation *)local_98;
      unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
      unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
                ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_stack_fffffffffffffef0,
                 (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                  *)in_stack_fffffffffffffee8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)0x196089e);
      unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                     *)0x19608a8);
      local_98._8_8_ = (long)(_func_int ***)local_98._8_8_ + 1;
    }
    ::std::
    vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
    ::push_back((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                 *)in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *)0x196098b);
    local_68 = local_68 + 1;
  }
  QueryResult::DeduplicateColumns(in_stack_000000d0);
  Relation::TryBindRelation(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  return;
}

Assistant:

ValueRelation::ValueRelation(const shared_ptr<RelationContextWrapper> &context, const vector<vector<Value>> &values,
                             vector<string> names_p, string alias_p)
    : Relation(context, RelationType::VALUE_LIST_RELATION), names(std::move(names_p)), alias(std::move(alias_p)) {
	// create constant expressions for the values
	for (idx_t row_idx = 0; row_idx < values.size(); row_idx++) {
		auto &list = values[row_idx];
		vector<unique_ptr<ParsedExpression>> expressions;
		for (idx_t col_idx = 0; col_idx < list.size(); col_idx++) {
			expressions.push_back(make_uniq<ConstantExpression>(list[col_idx]));
		}
		this->expressions.push_back(std::move(expressions));
	}
	QueryResult::DeduplicateColumns(names);
	TryBindRelation(columns);
}